

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::LossParameter::MergePartialFromCodedStream(LossParameter *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  void *pvVar4;
  uint8 *puVar5;
  bool bVar6;
  uint32 uVar7;
  uint uVar8;
  long in_RAX;
  int iVar9;
  UnknownFieldSet *pUVar10;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  pair<unsigned_long,_bool> pVar14;
  undefined8 uStack_38;
  
  this_00 = &this->_internal_metadata_;
  uStack_38 = in_RAX;
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003add94;
      input->buffer_ = pbVar3 + 1;
      uVar13 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003add94:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar13 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar13 = 0x100000000;
      }
      uVar13 = uVar7 | uVar13;
    }
    uVar12 = (uint)uVar13;
    iVar9 = 6;
    if ((uVar13 & 0x100000000) == 0) {
LAB_003addb6:
      if ((uVar12 & 7) == 4 || uVar12 == 0) {
        iVar9 = 7;
      }
      else {
        pvVar4 = (this_00->
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ).ptr_;
        if (((ulong)pvVar4 & 1) == 0) {
          pUVar10 = google::protobuf::internal::
                    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    ::mutable_unknown_fields_slow
                              (&this_00->
                                super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              );
        }
        else {
          pUVar10 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
        }
        bVar6 = google::protobuf::internal::WireFormat::SkipField(input,uVar12,pUVar10);
        if (bVar6) goto LAB_003ade3b;
      }
    }
    else {
      uVar8 = (uint)(uVar13 >> 3) & 0x1fffffff;
      cVar11 = (char)uVar13;
      if (uVar8 != 3) {
        if (uVar8 == 2) {
          if (cVar11 != '\x10') goto LAB_003addb6;
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          puVar5 = input->buffer_;
          if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (long)(char)uVar2)) {
            input->buffer_ = puVar5 + 1;
            pVar14._8_8_ = 1;
            pVar14.first = (long)(char)uVar2;
          }
          else {
            pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          }
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            this->normalize_ = pVar14.first != 0;
            goto LAB_003ade3b;
          }
          goto LAB_003ade3d;
        }
        if ((uVar8 != 1) || (cVar11 != '\b')) goto LAB_003addb6;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar13 = (ulong)bVar1;
          uVar7 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003adf26;
          input->buffer_ = pbVar3 + 1;
          bVar6 = true;
        }
        else {
          uVar7 = 0;
LAB_003adf26:
          uVar13 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          bVar6 = -1 < (long)uVar13;
        }
        if (bVar6) {
          this->ignore_label_ = (int32)uVar13;
          goto LAB_003ade3b;
        }
        goto LAB_003ade3d;
      }
      if (cVar11 != '\x18') goto LAB_003addb6;
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar1 = *pbVar3;
        uVar13 = (ulong)bVar1;
        uVar7 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003adec7;
        input->buffer_ = pbVar3 + 1;
        bVar6 = true;
      }
      else {
        uVar7 = 0;
LAB_003adec7:
        uVar13 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
        bVar6 = -1 < (long)uVar13;
      }
      uVar12 = uStack_38._4_4_;
      if (bVar6) {
        uVar12 = (uint)uVar13;
      }
      uStack_38 = (ulong)uVar12 << 0x20;
      if (bVar6) {
        if (uVar12 < 4) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          this->normalization_ = uVar12;
        }
        else {
          pvVar4 = (this_00->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar4 & 1) == 0) {
            pUVar10 = google::protobuf::internal::
                      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ::mutable_unknown_fields_slow
                                (&this_00->
                                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                );
          }
          else {
            pUVar10 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
          }
          google::protobuf::UnknownFieldSet::AddVarint(pUVar10,3,(long)(int)uVar12);
        }
        iVar9 = 0;
      }
      if (bVar6) {
LAB_003ade3b:
        iVar9 = 0;
      }
    }
LAB_003ade3d:
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool LossParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.LossParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional int32 ignore_label = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_ignore_label();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &ignore_label_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool normalize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_normalize();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &normalize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.LossParameter.NormalizationMode normalization = 3 [default = VALID];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::LossParameter_NormalizationMode_IsValid(value)) {
            set_normalization(static_cast< ::caffe::LossParameter_NormalizationMode >(value));
          } else {
            mutable_unknown_fields()->AddVarint(3, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.LossParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.LossParameter)
  return false;
#undef DO_
}